

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall testing::ExpectationSet::ExpectationSet(ExpectationSet *this,Expectation *e)

{
  Expectation *e_local;
  ExpectationSet *this_local;
  
  std::set<testing::Expectation,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::set(&this->expectations_);
  operator+=(this,e);
  return;
}

Assistant:

ExpectationSet(const Expectation& e) {  // NOLINT
    *this += e;
  }